

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.h
# Opt level: O3

bool __thiscall rcdiscover::DeviceInfo::operator<(DeviceInfo *this,DeviceInfo *info)

{
  bool bVar1;
  tuple<const_unsigned_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_20;
  tuple<const_unsigned_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_10;
  
  local_10.
  super__Tuple_impl<0UL,_const_unsigned_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl = &this->mac;
  local_20.
  super__Tuple_impl<0UL,_const_unsigned_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  .super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl = &info->mac;
  bVar1 = true;
  if (info->mac <= this->mac) {
    if (info->mac < this->mac) {
      bVar1 = false;
    }
    else {
      local_20.
      super__Tuple_impl<0UL,_const_unsigned_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
            )(_Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
              )info;
      local_10.
      super__Tuple_impl<0UL,_const_unsigned_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Tuple_impl<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
            )(_Head_base<1UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
              )this;
      bVar1 = std::
              __tuple_compare<std::tuple<const_unsigned_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_unsigned_long_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_1UL,_2UL>
              ::__less(&local_10,&local_20);
    }
  }
  return bVar1;
}

Assistant:

bool operator < (const DeviceInfo &info) const
    { return std::tie(mac, iface_name) < std::tie(info.mac, info.iface_name); }